

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void mi_vfprintf_thread(mi_output_fun *out,void *arg,char *prefix,char *fmt,__va_list_tag *args)

{
  _Bool _Var1;
  size_t sVar2;
  mi_threadid_t mVar3;
  char *in_RDX;
  char tprefix [64];
  __va_list_tag *in_stack_00000180;
  char *in_stack_00000188;
  char *in_stack_00000190;
  void *in_stack_00000198;
  mi_output_fun *in_stack_000001a0;
  char local_68 [80];
  char *local_18;
  
  if (((in_RDX != (char *)0x0) &&
      (local_18 = in_RDX, sVar2 = _mi_strnlen(in_RDX,0x21), sVar2 < 0x21)) &&
     (_Var1 = _mi_is_main_thread(), !_Var1)) {
    mVar3 = _mi_thread_id();
    _mi_snprintf(local_68,0x40,"%sthread 0x%tx: ",local_18,mVar3);
    mi_vfprintf(in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188,
                in_stack_00000180);
    return;
  }
  mi_vfprintf(in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188,
              in_stack_00000180);
  return;
}

Assistant:

static void mi_vfprintf_thread(mi_output_fun* out, void* arg, const char* prefix, const char* fmt, va_list args) {
  if (prefix != NULL && _mi_strnlen(prefix,33) <= 32 && !_mi_is_main_thread()) {
    char tprefix[64];
    _mi_snprintf(tprefix, sizeof(tprefix), "%sthread 0x%tx: ", prefix, (uintptr_t)_mi_thread_id());
    mi_vfprintf(out, arg, tprefix, fmt, args);
  }
  else {
    mi_vfprintf(out, arg, prefix, fmt, args);
  }
}